

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSerialReadClose(uint gpio)

{
  char *pcVar1;
  uint in_EDI;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  uint in_stack_ffffffffffffffe0;
  FILE *pFVar3;
  undefined8 in_stack_ffffffffffffffe8;
  uint timeout;
  uint in_stack_fffffffffffffff0;
  int local_4;
  
  timeout = (uint)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pFVar3 = _stderr;
    pcVar1 = myTimeStamp();
    fprintf(pFVar3,"%s %s: gpio=%d\n",pcVar1,"gpioSerialReadClose",(ulong)in_EDI);
    in_stack_fffffffffffffff0 = (uint)pFVar3;
  }
  pFVar3 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar3,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar1,
              "gpioSerialReadClose");
    }
    local_4 = -0x1f;
  }
  else if (in_EDI < 0x20) {
    iVar2 = wfRx[in_EDI].mode;
    if (iVar2 == 0) {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar1 = myTimeStamp();
        fprintf(pFVar3,"%s %s: no serial read on gpio (%d)\n",pcVar1,"gpioSerialReadClose",
                (ulong)in_EDI);
      }
      local_4 = -0x26;
    }
    else {
      if (iVar2 == 1) {
        free(wfRx[in_EDI].field_4.s.buf);
        gpioSetWatchdog(in_stack_fffffffffffffff0,timeout);
        gpioSetAlertFunc(in_stack_ffffffffffffffe0,
                         (gpioAlertFunc_t)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
        wfRx[in_EDI].mode = 0;
      }
      local_4 = 0;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar3,"%s %s: bad gpio (%d)\n",pcVar1,"gpioSerialReadClose",(ulong)in_EDI);
    }
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int gpioSerialReadClose(unsigned gpio)
{
   DBG(DBG_USER, "gpio=%d", gpio);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   switch(wfRx[gpio].mode)
   {
      case PI_WFRX_NONE:

         SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

         break;

      case PI_WFRX_SERIAL:

         free(wfRx[gpio].s.buf);

         gpioSetWatchdog(gpio, 0); /* switch off timeouts */

         gpioSetAlertFunc(gpio, NULL); /* cancel alert */

         wfRx[gpio].mode = PI_WFRX_NONE;

         break;
   }

   return 0;
}